

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

void __thiscall
Sudoku::chooseOpenFieldInTestFieldsAndFixToSolution
          (Sudoku *this,FieldVector *testFields,int chooseFieldThatHasNPossibilities,
          bool fixFieldChooseRandomly,bool debug)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  undefined3 in_register_00000009;
  long lVar6;
  pointer psVar7;
  int local_44;
  
  iVar3 = (int)((ulong)((long)(testFields->
                              super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(testFields->
                             super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (CONCAT31(in_register_00000009,fixFieldChooseRandomly) == 0) {
    do {
      do {
        iVar1 = rand();
        iVar1 = iVar1 % iVar3;
        lVar6 = (long)iVar1;
        psVar7 = (testFields->
                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar2 = Field::value(psVar7[lVar6].super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
      } while (iVar2 != 0);
      psVar7 = psVar7 + lVar6;
      iVar2 = Field::n_possible((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
    } while (iVar2 != chooseFieldThatHasNPossibilities);
    local_44 = Field::pos_x((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  else {
    do {
      iVar1 = rand();
      iVar1 = iVar1 % iVar3;
      lVar6 = (long)iVar1;
      iVar2 = Field::value((testFields->
                           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[lVar6].
                           super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    } while (iVar2 != 0);
    local_44 = Field::pos_x((testFields->
                            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[lVar6].
                            super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    psVar7 = (testFields->
             super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>).
             _M_impl.super__Vector_impl_data._M_start + lVar6;
  }
  iVar3 = Field::pos_y((psVar7->super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  iVar2 = Field::value((this->field_begin_)._M_current[lVar6].
                       super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  Field::setValue((testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar6].
                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,iVar2);
  Field::setFixed((testFields->
                  super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar6].
                  super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true);
  if (debug) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fix field (",0xb);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_44);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") (index ",9);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") to value ",0xb);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", fixFieldChooseRandomly=",0x19);
    plVar5 = (long *)std::ostream::operator<<(poVar4,(uint)fixFieldChooseRandomly);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void Sudoku::chooseOpenFieldInTestFieldsAndFixToSolution(FieldVector &testFields, int chooseFieldThatHasNPossibilities, bool fixFieldChooseRandomly, bool debug)
{
  int posXtoFix = 0;
  int posYtoFix = 0;
  int index = 0;

  int nTestFields = testFields.size();

  // choose field coordinates (posXtoFix, posYtoFix) that gets fixed afterwards
  if(fixFieldChooseRandomly)
  {
    for(;;)
    {
      // choose a random field and check if it is not already set
      index = rand() % nTestFields;
      if(testFields[index]->value() == 0)
      {
        // store these coordinates
        posXtoFix = testFields[index]->pos_x();
        posYtoFix = testFields[index]->pos_y();

        //std::cout<<"r"<<testFields[index]->n_possible()<<" ";
        break;
      }
    }
  }
  else    // do not choose completely randomly
  {
    //take the first field that has the given number of posibilities
    //for(index = 0; index < testFields.size(); index++)

    //take a random field that has the given number of posibilities
    while(true)
    {
      index = rand() % nTestFields;
      std::shared_ptr<Field> &testField = testFields[index];

      if(testField->value() != 0)
        continue;

      if(testField->n_possible() == chooseFieldThatHasNPossibilities)
      {
        //std::cout<<"a"<<testFields[index]->n_possible()<<" ";
        posXtoFix = testField->pos_x();
        posYtoFix = testField->pos_y();
        break;
      }
    }
  }

  //int correctValue = fields_[index]->value();   // select correct value from solved sudoku
  int correctValue = (*(field_begin_+index))->value();   // select correct value from solved sudoku

  testFields[index]->setValue(correctValue);
  testFields[index]->setFixed(true);

  if(debug)
    std::cout<<"Fix field ("<<posXtoFix<<","<<posYtoFix<<") (index "<<index<<") to value "<<correctValue<<", fixFieldChooseRandomly="<<int(fixFieldChooseRandomly)<<std::endl;
}